

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O3

bool __thiscall wallet::BerkeleyROBatch::HasKey(BerkeleyROBatch *this,DataStream *key)

{
  BerkeleyRODatabase *pBVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  SerializeData key_data;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_28,
             (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + key->m_read_pos,
             (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish);
  pBVar1 = this->m_database;
  cVar2 = std::
          _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          ::find(&(pBVar1->m_records)._M_t,(key_type *)&local_28);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (_Rb_tree_header *)cVar2._M_node !=
           &(pBVar1->m_records)._M_t._M_impl.super__Rb_tree_header;
  }
  __stack_chk_fail();
}

Assistant:

bool BerkeleyROBatch::HasKey(DataStream&& key)
{
    SerializeData key_data{key.begin(), key.end()};
    return m_database.m_records.count(key_data) > 0;
}